

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

DiyFp rapidjson::internal::GetCachedPower(int e,int *K)

{
  int *in_RSI;
  int in_EDI;
  double dVar1;
  DiyFp DVar2;
  DiyFp DVar3;
  uint index;
  int k;
  double dk;
  undefined4 local_2c;
  
  dVar1 = (double)(-0x3d - in_EDI) * 0.30102999566398114 + 347.0;
  local_2c = (int)dVar1;
  if (0.0 < dVar1 - (double)local_2c) {
    local_2c = local_2c + 1;
  }
  *in_RSI = ((local_2c >> 3) + 1) * -8 + 0x15c;
  DVar2 = GetCachedPowerByIndex(0x3b5663);
  DVar3._12_4_ = 0;
  DVar3.f = SUB128(DVar2._0_12_,0);
  DVar3.e = SUB124(DVar2._0_12_,8);
  return DVar3;
}

Assistant:

inline DiyFp GetCachedPower(int e, int* K) {

    //int k = static_cast<int>(ceil((-61 - e) * 0.30102999566398114)) + 374;
    double dk = (-61 - e) * 0.30102999566398114 + 347;  // dk must be positive, so can do ceiling in positive
    int k = static_cast<int>(dk);
    if (dk - k > 0.0)
        k++;

    unsigned index = static_cast<unsigned>((k >> 3) + 1);
    *K = -(-348 + static_cast<int>(index << 3));    // decimal exponent no need lookup table

    return GetCachedPowerByIndex(index);
}